

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O0

void __thiscall
tchecker::zg::path::concrete::finite_path_t::add_first_node
          (finite_path_t *this,const_state_sptr_t *s,clockval_t *clockval,bool initial,bool final)

{
  tuple<tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>,_bool,_bool>
  local_60;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>
  local_38;
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>
  local_30;
  const_clockval_sptr_t clockval_sptr;
  bool final_local;
  bool initial_local;
  clockval_t *clockval_local;
  const_state_sptr_t *s_local;
  finite_path_t *this_local;
  
  clockval_sptr._t._6_1_ = final;
  clockval_sptr._t._7_1_ = initial;
  pool_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>>::
  construct<tchecker::clockval_t_const&>
            ((pool_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>> *)&local_38,
             (clockval_t *)&this->_clockval_pool);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>const>::
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>>
            ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>const>
              *)&local_30,&local_38);
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>::
  ~intrusive_shared_ptr_t(&local_38);
  std::
  make_tuple<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>const>const&,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>const>&,bool&,bool&>
            (&local_60,s,&local_30,(bool *)((long)&clockval_sptr._t + 7),
             (bool *)((long)&clockval_sptr._t + 6));
  tchecker::graph::
  finite_path_t<tchecker::zg::path::concrete::node_t,tchecker::zg::path::concrete::edge_t>::
  add_first_node<std::tuple<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::zg::state_t,unsigned_long,1ul>const>,tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::clockval_t,unsigned_long,1ul>const>,bool,bool>>
            ((finite_path_t<tchecker::zg::path::concrete::node_t,tchecker::zg::path::concrete::edge_t>
              *)this,&local_60);
  std::
  tuple<tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::zg::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>,_bool,_bool>
  ::~tuple(&local_60);
  intrusive_shared_ptr_t<const_tchecker::make_shared_t<tchecker::clockval_t,_unsigned_long,_1UL>_>::
  ~intrusive_shared_ptr_t(&local_30);
  return;
}

Assistant:

void finite_path_t::add_first_node(tchecker::zg::const_state_sptr_t const & s, tchecker::clockval_t const & clockval,
                                   bool initial, bool final)
{
  tchecker::const_clockval_sptr_t clockval_sptr{_clockval_pool.construct(clockval)};
  tchecker::ts::finite_path_t<tchecker::zg::zg_t, tchecker::zg::path::concrete::node_t,
                              tchecker::zg::path::concrete::edge_t>::add_first_node(std::make_tuple(s, clockval_sptr, initial,
                                                                                                    final));
}